

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferViewAccessTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::BufferViewTestInstance::checkResult
          (TestStatus *__return_storage_ptr__,BufferViewTestInstance *this,deInt8 factor)

{
  Allocation *pAVar1;
  DeviceInterface *vkd;
  VkDevice device;
  TextureLevel *this_00;
  ostream *poVar2;
  int iVar3;
  int y;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> resultLevel;
  string local_208;
  TextureFormat tcuFormat;
  IVec4 pixel;
  ConstPixelBufferAccess pixelBuffer;
  ostringstream errorMessage;
  
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  tcuFormat = ::vk::mapVkFormat(this->m_colorFormat);
  this_00 = (TextureLevel *)operator_new(0x28);
  tcu::TextureLevel::TextureLevel
            (this_00,&tcuFormat,(this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],1);
  pAVar1 = (this->m_resultBufferAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  resultLevel.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr
       = this_00;
  ::vk::invalidateMappedMemoryRange
            (vkd,device,(VkDeviceMemory)(pAVar1->m_memory).m_internal,pAVar1->m_offset,
             this->m_pixelDataSize);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&errorMessage,
             resultLevel.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
             .m_data.ptr);
  local_208._M_dataplus._M_p =
       *(pointer *)
        &(resultLevel.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
          m_data.ptr)->m_format;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&pixelBuffer,(TextureFormat *)&local_208,
             &(resultLevel.
               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
              ptr)->m_size,
             ((this->m_resultBufferAlloc).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr);
  tcu::copy((EVP_PKEY_CTX *)&errorMessage,(EVP_PKEY_CTX *)&pixelBuffer);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&errorMessage,
             resultLevel.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
             .m_data.ptr);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&pixelBuffer,(ConstPixelBufferAccess *)&errorMessage);
  y = 0;
  do {
    if ((this->m_renderSize).m_data[0] <= y) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&errorMessage,"BufferView test",(allocator<char> *)&local_208);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)&errorMessage);
      std::__cxx11::string::~string((string *)&errorMessage);
LAB_0047d60a:
      de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
      ~UniqueBase(&resultLevel.
                   super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
      return __return_storage_ptr__;
    }
    tcu::ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)&pixel,(int)&pixelBuffer,y,y)
    ;
    iVar3 = ((this->m_testCase).elementOffset + y) * (uint)(byte)factor;
    if (iVar3 != pixel.m_data[0]) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorMessage);
      poVar2 = std::operator<<((ostream *)&errorMessage,"BufferView test failed. expected: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
      poVar2 = std::operator<<(poVar2," actual: ");
      std::ostream::operator<<(poVar2,pixel.m_data[0]);
      std::__cxx11::stringbuf::str();
      tcu::TestStatus::fail(__return_storage_ptr__,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errorMessage);
      goto LAB_0047d60a;
    }
    y = y + 1;
  } while( true );
}

Assistant:

tcu::TestStatus BufferViewTestInstance::checkResult (deInt8 factor)
{
	const DeviceInterface&			vk					= m_context.getDeviceInterface();
	const VkDevice					vkDevice			= m_context.getDevice();
	const tcu::TextureFormat		tcuFormat			= mapVkFormat(m_colorFormat);
	de::MovePtr<tcu::TextureLevel>	resultLevel			(new tcu::TextureLevel(tcuFormat, m_renderSize.x(), m_renderSize.y()));

	invalidateMappedMemoryRange(vk, vkDevice, m_resultBufferAlloc->getMemory(), m_resultBufferAlloc->getOffset(), m_pixelDataSize);
	tcu::copy(*resultLevel, tcu::ConstPixelBufferAccess(resultLevel->getFormat(), resultLevel->getSize(), m_resultBufferAlloc->getHostPtr()));

	tcu::ConstPixelBufferAccess pixelBuffer = resultLevel->getAccess();
	for (deInt32 i = 0; i < (deInt32) m_renderSize.x(); ++i)
	{
		tcu::IVec4 pixel	= pixelBuffer.getPixelInt(i, i);
		deInt32 expected	= factor * (m_testCase.elementOffset + i);
		deInt32 actual		= pixel[0];
		if (expected != actual)
		{
			std::ostringstream errorMessage;
			errorMessage << "BufferView test failed. expected: " << expected << " actual: " << actual;
			return tcu::TestStatus::fail(errorMessage.str());
		}
	}

	return tcu::TestStatus::pass("BufferView test");
}